

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  string *psVar1;
  int iVar2;
  cmake *this_00;
  cmState *this_01;
  char *pcVar3;
  string *psVar4;
  long lVar5;
  ostream *poVar6;
  void *this_02;
  char *pcVar7;
  string local_100 [36];
  uint local_dc;
  long lStack_d8;
  uint jobs;
  size_type eq;
  string *pool;
  size_t i;
  string local_b8;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *jobpools;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  jobpools = (char *)os;
  os_local = (ostream *)this;
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"JOB_POOLS",&local_41);
  pcVar3 = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar7 = jobpools;
  if (pcVar3 != (char *)0x0) {
    local_20 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"Pools defined by global property JOB_POOLS",
               (allocator *)
               ((long)&pools.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmGlobalNinjaGenerator::WriteComment((ostream *)pcVar7,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pools.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98);
    pcVar7 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar7,(allocator *)((long)&i + 7));
    cmSystemTools::ExpandListArgument
              (&local_b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    pool = (string *)0x0;
    while( true ) {
      psVar1 = pool;
      psVar4 = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_98);
      if (psVar4 <= psVar1) break;
      eq = (size_type)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_98,(size_type)pool);
      lStack_d8 = std::__cxx11::string::find((char)eq,0x3d);
      if (lStack_d8 == -1) {
LAB_0065904d:
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error
                  ("Invalid pool defined by property \'JOB_POOLS\': ",pcVar7,(char *)0x0,(char *)0x0
                  );
      }
      else {
        lVar5 = std::__cxx11::string::c_str();
        iVar2 = __isoc99_sscanf(lVar5 + lStack_d8,"=%u",&local_dc);
        if (iVar2 != 1) goto LAB_0065904d;
        poVar6 = std::operator<<((ostream *)jobpools,"pool ");
        std::__cxx11::string::substr((ulong)local_100,eq);
        poVar6 = std::operator<<(poVar6,local_100);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_100);
        poVar6 = std::operator<<((ostream *)jobpools,"  depth = ");
        this_02 = (void *)std::ostream::operator<<(poVar6,local_dc);
        std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(jobpools,std::endl<char,std::char_traits<char>>);
      }
      pool = (string *)&pool->field_0x1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  const char* jobpools =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("JOB_POOLS");
  if (jobpools) {
    cmGlobalNinjaGenerator::WriteComment(
      os, "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools;
    cmSystemTools::ExpandListArgument(jobpools, pools);
    for (size_t i = 0; i < pools.size(); ++i) {
      std::string const& pool = pools[i];
      const std::string::size_type eq = pool.find('=');
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1) {
        os << "pool " << pool.substr(0, eq) << std::endl;
        os << "  depth = " << jobs << std::endl;
        os << std::endl;
      } else {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': ",
                             pool.c_str());
      }
    }
  }
}